

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# csv.h
# Opt level: O2

void __thiscall
io::
CSVReader<12u,io::trim_chars<(char)32,(char)9>,io::no_quote_escape<(char)44>,io::throw_on_overflow,io::no_comment>
::set_column_names<char_const*,char_const*,char_const*,char_const*,char_const*>
          (CSVReader<12u,io::trim_chars<(char)32,(char)9>,io::no_quote_escape<(char)44>,io::throw_on_overflow,io::no_comment>
           *this,string *s,char *cols,char *cols_1,char *cols_2,char *cols_3,char *cols_4)

{
  string local_60;
  char *local_40;
  allocator local_31;
  
  local_40 = cols_3;
  std::__cxx11::string::operator=((string *)(this + 0x2f0),(string *)s);
  std::__cxx11::string::string((string *)&local_60,cols,&local_31);
  set_column_names<char_const*,char_const*,char_const*,char_const*>
            (this,&local_60,cols_1,cols_2,local_40,cols_4);
  std::__cxx11::string::~string((string *)&local_60);
  return;
}

Assistant:

void set_column_names(std::string s, ColNames...cols){
                        column_names[column_count-sizeof...(ColNames)-1] = std::move(s);
                        set_column_names(std::forward<ColNames>(cols)...);
                }